

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_skip_bytes(mpack_reader_t *reader,size_t count)

{
  mpack_error_t mVar1;
  size_t left;
  size_t count_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    mpack_reader_track_bytes(reader,count);
    if ((ulong)((long)reader->end - (long)reader->data) < count) {
      mpack_skip_bytes_straddle(reader,count);
    }
    else {
      reader->data = reader->data + count;
    }
  }
  return;
}

Assistant:

void mpack_skip_bytes(mpack_reader_t* reader, size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return;
    mpack_log("skip requested for %i bytes\n", (int)count);
    mpack_reader_track_bytes(reader, count);

    // check if we have enough in the buffer already
    size_t left = (size_t)(reader->end - reader->data);
    if (left >= count) {
        mpack_log("skipping %i bytes still in buffer\n", (int)count);
        reader->data += count;
        return;
    }

    mpack_skip_bytes_straddle(reader, count);
}